

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFVersion.cc
# Opt level: O0

void __thiscall PDFVersion::getVersion(PDFVersion *this,string *version,int *extension_level)

{
  string local_b0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int *local_20;
  int *extension_level_local;
  string *version_local;
  PDFVersion *this_local;
  
  *extension_level = this->extension_level;
  local_20 = extension_level;
  extension_level_local = (int *)version;
  version_local = (string *)this;
  std::__cxx11::to_string(&local_80,this->major_version);
  std::operator+(&local_60,&local_80,".");
  std::__cxx11::to_string(&local_b0,this->minor_version);
  std::operator+(&local_40,&local_60,&local_b0);
  std::__cxx11::string::operator=((string *)extension_level_local,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void
PDFVersion::getVersion(std::string& version, int& extension_level) const
{
    extension_level = this->extension_level;
    version = std::to_string(this->major_version) + "." + std::to_string(this->minor_version);
}